

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Read
          (SequentialFileImpl *this,size_t n,Slice *result,char *scratch)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FileState::Read((FileState *)this,*(uint64_t *)(n + 8),*(size_t *)(n + 0x10),result,scratch);
  if ((this->super_SequentialFile)._vptr_SequentialFile == (_func_int **)0x0) {
    *(long *)(n + 0x10) = *(long *)(n + 0x10) + *(long *)(scratch + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status s = file_->Read(pos_, n, result, scratch);
    if (s.ok()) {
      pos_ += result->size();
    }
    return s;
  }